

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_conn.c
# Opt level: O3

csp_conn_t * csp_conn_find_dport(uint dport)

{
  long lVar1;
  
  lVar1 = 0;
  while ((((byte)arr_conn[0].rx_queue_static_data[lVar1 + -0x22] != dport ||
          (*(int *)(arr_conn[0].rx_queue_static_data + lVar1 + -0x2c) != 1)) ||
         (*(int *)(arr_conn[0].rx_queue_static_data + lVar1 + -0x30) != 0))) {
    lVar1 = lVar1 + 0x118;
    if (lVar1 == 0x8c0) {
      return (csp_conn_t *)0x0;
    }
  }
  return (csp_conn_t *)(arr_conn[0].rx_queue_static_data + lVar1 + -0x30);
}

Assistant:

csp_conn_t * csp_conn_find_dport(unsigned int dport) {

	for (int i = 0; i < CSP_CONN_MAX; i++) {
		csp_conn_t * conn = &arr_conn[i];

		/* Connection must match dport */
		if (conn->idin.dport != dport)
			continue;

		/* Connection must be open */
		if (conn->state != CONN_OPEN)
			continue;

		/* Connection must be client */
		if (conn->type != CONN_CLIENT)
			continue;

		/* All conditions found! */
		return conn;
	}

	return NULL;
}